

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * ensure(printbuffer *p,int needed)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  
  if (p->buffer != (char *)0x0) {
    iVar2 = needed + p->offset;
    if (p->length < iVar2) {
      uVar3 = iVar2 - 1;
      uVar3 = (int)uVar3 >> 1 | uVar3;
      uVar3 = (int)uVar3 >> 2 | uVar3;
      uVar3 = (int)uVar3 >> 4 | uVar3;
      uVar3 = (int)uVar3 >> 8 | uVar3;
      iVar2 = ((int)uVar3 >> 0x10 | uVar3) + 1;
      pcVar1 = (char *)(*cJSON_malloc)((long)iVar2);
      if (pcVar1 == (char *)0x0) {
        (*cJSON_free)(p->buffer);
        p->length = 0;
        p->buffer = (char *)0x0;
        pcVar1 = (char *)0x0;
      }
      else {
        memcpy(pcVar1,p->buffer,(long)p->length);
        (*cJSON_free)(p->buffer);
        p->length = iVar2;
        p->buffer = pcVar1;
        pcVar1 = pcVar1 + p->offset;
      }
    }
    else {
      pcVar1 = p->buffer + p->offset;
    }
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

static char* ensure(printbuffer *p,int needed)
{
	char *newbuffer;int newsize;
	if (!p || !p->buffer) return 0;
	needed+=p->offset;
	if (needed<=p->length) return p->buffer+p->offset;

	newsize=pow2gt(needed);
	newbuffer=(char*)cJSON_malloc(newsize);
	if (!newbuffer) {cJSON_free(p->buffer);p->length=0,p->buffer=0;return 0;}
	if (newbuffer) memcpy(newbuffer,p->buffer,p->length);
	cJSON_free(p->buffer);
	p->length=newsize;
	p->buffer=newbuffer;
	return newbuffer+p->offset;
}